

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_code_span(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,MD_MARK *opener,
                   MD_MARK *closer,MD_OFFSET *last_potential_closers,int *p_reached_paragraph_end)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  MD_SIZE line_index;
  int has_only_space;
  int has_eol_before_closer;
  int has_space_before_closer;
  int has_eol_after_opener;
  int has_space_after_opener;
  MD_OFFSET line_end;
  MD_SIZE mark_len;
  MD_OFFSET closer_end;
  MD_OFFSET closer_beg;
  MD_OFFSET opener_end;
  MD_OFFSET opener_beg;
  MD_MARK *closer_local;
  MD_MARK *opener_local;
  MD_OFFSET beg_local;
  MD_SIZE n_lines_local;
  MD_LINE *lines_local;
  MD_CTX *ctx_local;
  
  bVar5 = true;
  line_index = 0;
  line_end = lines->end;
  opener_end = beg;
  while( true ) {
    bVar2 = false;
    if (opener_end < line_end) {
      bVar2 = ctx->text[opener_end] == '`';
    }
    if (!bVar2) break;
    opener_end = opener_end + 1;
  }
  bVar2 = false;
  if (opener_end < line_end) {
    bVar2 = ctx->text[opener_end] == ' ';
  }
  bVar3 = opener_end == line_end;
  opener->end = opener_end;
  uVar1 = opener_end - beg;
  if (((uVar1 < 0x21) && (last_potential_closers[uVar1 - 1] < lines[n_lines - 1].end)) &&
     ((*p_reached_paragraph_end == 0 || (opener_end <= last_potential_closers[uVar1 - 1])))) {
    closer_beg = opener_end;
    while( true ) {
      while( true ) {
        while( true ) {
          bVar4 = false;
          if (closer_beg < line_end) {
            bVar4 = ctx->text[closer_beg] != '`';
          }
          if (!bVar4) break;
          if (ctx->text[closer_beg] != ' ') {
            bVar5 = false;
          }
          closer_beg = closer_beg + 1;
        }
        closer_end = closer_beg;
        while( true ) {
          bVar4 = false;
          if (closer_end < line_end) {
            bVar4 = ctx->text[closer_end] == '`';
          }
          if (!bVar4) break;
          closer_end = closer_end + 1;
        }
        if (closer_end - closer_beg == uVar1) {
          bVar4 = false;
          if (lines[line_index].beg < closer_beg) {
            bVar4 = ctx->text[closer_beg - 1] == ' ';
          }
          if (((!bVar5) && ((bVar2 || (bVar3)))) &&
             ((bVar4 || (closer_beg == lines[line_index].beg)))) {
            if (bVar2) {
              opener_end = opener_end + 1;
            }
            else {
              opener_end = lines[1].beg;
            }
            if (bVar4) {
              closer_beg = closer_beg - 1;
            }
            else {
              closer_beg = lines[line_index - 1].end;
              while( true ) {
                bVar5 = false;
                if ((closer_beg < ctx->size) && (bVar5 = true, ctx->text[closer_beg] != ' ')) {
                  bVar5 = ctx->text[closer_beg] == '\t';
                }
                if (!bVar5) break;
                closer_beg = closer_beg + 1;
              }
            }
          }
          opener->ch = '`';
          opener->beg = beg;
          opener->end = opener_end;
          opener->flags = '\x01';
          closer->ch = '`';
          closer->beg = closer_beg;
          closer->end = closer_end;
          closer->flags = '\x02';
          return 1;
        }
        if (((closer_end != closer_beg) && (bVar5 = false, closer_end - closer_beg < 0x20)) &&
           (last_potential_closers[(closer_end - closer_beg) - 1] < closer_beg)) {
          last_potential_closers[(closer_end - closer_beg) - 1] = closer_beg;
        }
        if (line_end <= closer_end) break;
        closer_beg = closer_end;
      }
      line_index = line_index + 1;
      if (n_lines <= line_index) break;
      line_end = lines[line_index].end;
      closer_beg = lines[line_index].beg;
    }
    *p_reached_paragraph_end = 1;
  }
  return 0;
}

Assistant:

static int
md_is_code_span(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, OFF beg,
                MD_MARK* opener, MD_MARK* closer,
                OFF last_potential_closers[CODESPAN_MARK_MAXLEN],
                int* p_reached_paragraph_end)
{
    OFF opener_beg = beg;
    OFF opener_end;
    OFF closer_beg;
    OFF closer_end;
    SZ mark_len;
    OFF line_end;
    int has_space_after_opener = FALSE;
    int has_eol_after_opener = FALSE;
    int has_space_before_closer = FALSE;
    int has_eol_before_closer = FALSE;
    int has_only_space = TRUE;
    MD_SIZE line_index = 0;

    line_end = lines[0].end;
    opener_end = opener_beg;
    while(opener_end < line_end  &&  CH(opener_end) == _T('`'))
        opener_end++;
    has_space_after_opener = (opener_end < line_end && CH(opener_end) == _T(' '));
    has_eol_after_opener = (opener_end == line_end);

    /* The caller needs to know end of the opening mark even if we fail. */
    opener->end = opener_end;

    mark_len = opener_end - opener_beg;
    if(mark_len > CODESPAN_MARK_MAXLEN)
        return FALSE;

    /* Check whether we already know there is no closer of this length.
     * If so, re-scan does no sense. This fixes issue #59. */
    if(last_potential_closers[mark_len-1] >= lines[n_lines-1].end  ||
       (*p_reached_paragraph_end  &&  last_potential_closers[mark_len-1] < opener_end))
        return FALSE;

    closer_beg = opener_end;
    closer_end = opener_end;

    /* Find closer mark. */
    while(TRUE) {
        while(closer_beg < line_end  &&  CH(closer_beg) != _T('`')) {
            if(CH(closer_beg) != _T(' '))
                has_only_space = FALSE;
            closer_beg++;
        }
        closer_end = closer_beg;
        while(closer_end < line_end  &&  CH(closer_end) == _T('`'))
            closer_end++;

        if(closer_end - closer_beg == mark_len) {
            /* Success. */
            has_space_before_closer = (closer_beg > lines[line_index].beg && CH(closer_beg-1) == _T(' '));
            has_eol_before_closer = (closer_beg == lines[line_index].beg);
            break;
        }

        if(closer_end - closer_beg > 0) {
            /* We have found a back-tick which is not part of the closer. */
            has_only_space = FALSE;

            /* But if we eventually fail, remember it as a potential closer
             * of its own length for future attempts. This mitigates needs for
             * rescans. */
            if(closer_end - closer_beg < CODESPAN_MARK_MAXLEN) {
                if(closer_beg > last_potential_closers[closer_end - closer_beg - 1])
                    last_potential_closers[closer_end - closer_beg - 1] = closer_beg;
            }
        }

        if(closer_end >= line_end) {
            line_index++;
            if(line_index >= n_lines) {
                /* Reached end of the paragraph and still nothing. */
                *p_reached_paragraph_end = TRUE;
                return FALSE;
            }
            /* Try on the next line. */
            line_end = lines[line_index].end;
            closer_beg = lines[line_index].beg;
        } else {
            closer_beg = closer_end;
        }
    }

    /* If there is a space or a new line both after and before the opener
     * (and if the code span is not made of spaces only), consume one initial
     * and one trailing space as part of the marks. */
    if(!has_only_space  &&
       (has_space_after_opener || has_eol_after_opener)  &&
       (has_space_before_closer || has_eol_before_closer))
    {
        if(has_space_after_opener)
            opener_end++;
        else
            opener_end = lines[1].beg;

        if(has_space_before_closer)
            closer_beg--;
        else {
            /* Go back to the end of prev line */
            closer_beg = lines[line_index-1].end;
            /* But restore any trailing whitespace */
            while(closer_beg < ctx->size  &&  ISBLANK(closer_beg))
                closer_beg++;
        }
    }

    opener->ch = _T('`');
    opener->beg = opener_beg;
    opener->end = opener_end;
    opener->flags = MD_MARK_POTENTIAL_OPENER;
    closer->ch = _T('`');
    closer->beg = closer_beg;
    closer->end = closer_end;
    closer->flags = MD_MARK_POTENTIAL_CLOSER;
    return TRUE;
}